

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

void __thiscall
mjs::interpreter::impl::auto_stack_update::~auto_stack_update(auto_stack_update *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  uint32_t uVar3;
  impl *piVar4;
  
  piVar4 = this->parent_;
  psVar1 = (piVar4->stack_trace_).
           super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (((((piVar4->stack_trace_).
         super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl.
         super__Vector_impl_data._M_start == psVar1) ||
       (psVar1[-1].file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (this->pos_).file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr))
      || (psVar1[-1].start != (this->pos_).start)) || (psVar1[-1].end != (this->pos_).end)) {
    __assert_fail("!parent_.stack_trace_.empty() && parent_.stack_trace_.back() == pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                  ,0x4ee,"mjs::interpreter::impl::auto_stack_update::~auto_stack_update()");
  }
  (piVar4->stack_trace_).super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar1 + -1;
  p_Var2 = psVar1[-1].file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    piVar4 = this->parent_;
  }
  (piVar4->current_extend_).file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (this->old_extend_).file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  __r = &(this->old_extend_).file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(piVar4->current_extend_).file.
              super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__r);
  uVar3 = (this->old_extend_).end;
  (piVar4->current_extend_).start = (this->old_extend_).start;
  (piVar4->current_extend_).end = uVar3;
  p_Var2 = (this->pos_).file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = __r->_M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    return;
  }
  return;
}

Assistant:

~auto_stack_update() {
            assert(!parent_.stack_trace_.empty() && parent_.stack_trace_.back() == pos_);
            parent_.stack_trace_.pop_back();
            parent_.current_extend_ = old_extend_;
        }